

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

uint32_t findTaggedAliasListsOffset(char *alias,char *standard,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t tempListOffset;
  uint32_t currConvNum;
  uint32_t currTagNum;
  uint32_t tagNum;
  UErrorCode myErr;
  uint32_t convNum;
  uint32_t listOffset;
  uint32_t idx;
  UErrorCode *pErrorCode_local;
  char *standard_local;
  char *alias_local;
  
  currTagNum = 0;
  _listOffset = pErrorCode;
  pErrorCode_local = (UErrorCode *)standard;
  standard_local = alias;
  uVar2 = getTagNumber(standard);
  tagNum = findConverter(standard_local,(UBool *)0x0,(UErrorCode *)&currTagNum);
  if (currTagNum != 0) {
    *_listOffset = currTagNum;
  }
  if ((uVar2 < gMainTable.tagListSize - 1) && (tagNum < gMainTable.converterListSize)) {
    alias_local._4_4_ =
         (uint)gMainTable.taggedAliasArray[uVar2 * gMainTable.converterListSize + tagNum];
    if ((alias_local._4_4_ == 0) || (gMainTable.taggedAliasLists[alias_local._4_4_ + 1] == 0)) {
      if (currTagNum == 0xffffff86) {
        for (convNum = 0; convNum < gMainTable.taggedAliasArraySize; convNum = convNum + 1) {
          myErr = (UErrorCode)gMainTable.taggedAliasArray[convNum];
          if ((((myErr != U_ZERO_ERROR) &&
               (UVar1 = isAliasInList(standard_local,myErr), UVar1 != '\0')) &&
              (uVar3 = (uint)gMainTable.taggedAliasArray
                             [uVar2 * gMainTable.converterListSize +
                              (convNum -
                              (convNum / gMainTable.converterListSize) *
                              gMainTable.converterListSize)], uVar3 != 0)) &&
             (gMainTable.taggedAliasLists[uVar3 + 1] != 0)) {
            return uVar3;
          }
        }
      }
      alias_local._4_4_ = 0;
    }
  }
  else {
    alias_local._4_4_ = 0xffffffff;
  }
  return alias_local._4_4_;
}

Assistant:

static uint32_t
findTaggedAliasListsOffset(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    uint32_t idx;
    uint32_t listOffset;
    uint32_t convNum;
    UErrorCode myErr = U_ZERO_ERROR;
    uint32_t tagNum = getTagNumber(standard);

    /* Make a quick guess. Hopefully they used a TR22 canonical alias. */
    convNum = findConverter(alias, NULL, &myErr);
    if (myErr != U_ZERO_ERROR) {
        *pErrorCode = myErr;
    }

    if (tagNum < (gMainTable.tagListSize - UCNV_NUM_HIDDEN_TAGS) && convNum < gMainTable.converterListSize) {
        listOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + convNum];
        if (listOffset && gMainTable.taggedAliasLists[listOffset + 1]) {
            return listOffset;
        }
        if (myErr == U_AMBIGUOUS_ALIAS_WARNING) {
            /* Uh Oh! They used an ambiguous alias.
               We have to search the whole swiss cheese starting
               at the highest standard affinity.
               This may take a while.
            */
            for (idx = 0; idx < gMainTable.taggedAliasArraySize; idx++) {
                listOffset = gMainTable.taggedAliasArray[idx];
                if (listOffset && isAliasInList(alias, listOffset)) {
                    uint32_t currTagNum = idx/gMainTable.converterListSize;
                    uint32_t currConvNum = (idx - currTagNum*gMainTable.converterListSize);
                    uint32_t tempListOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + currConvNum];
                    if (tempListOffset && gMainTable.taggedAliasLists[tempListOffset + 1]) {
                        return tempListOffset;
                    }
                    /* else keep on looking */
                    /* We could speed this up by starting on the next row
                       because an alias is unique per row, right now.
                       This would change if alias versioning appears. */
                }
            }
            /* The standard doesn't know about the alias */
        }
        /* else no default name */
        return 0;
    }
    /* else converter or tag not found */

    return UINT32_MAX;
}